

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void resizeDeepBuffers<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
               *channels)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  _List_node_base *p_Var4;
  int y;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  _List_node_base *p_Var9;
  
  p_Var9 = (_List_node_base *)channels;
  while (p_Var9 = (((_List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                     *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)channels) {
    lVar3 = 0;
    lVar8 = 0;
    for (lVar5 = 0; lVar5 < (long)p_Var9[1]._M_next; lVar5 = lVar5 + 1) {
      p_Var4 = p_Var9[1]._M_prev;
      lVar1 = sampleCount->_sizeY;
      for (lVar7 = 0; lVar7 < (long)p_Var4; lVar7 = lVar7 + 1) {
        uVar6 = (ulong)*(uint *)((long)sampleCount->_data + lVar7 * 4 + lVar1 * lVar3);
        if (uVar6 == 0) {
          pvVar2 = (void *)0x0;
        }
        else {
          pvVar2 = operator_new__(uVar6 * 2);
          p_Var4 = p_Var9[1]._M_prev;
        }
        *(void **)((long)p_Var9[2]._M_next + lVar7 * 8 + lVar8 * (long)p_Var4) = pvVar2;
      }
      lVar8 = lVar8 + 8;
      lVar3 = lVar3 + 4;
    }
  }
  return;
}

Assistant:

void
resizeDeepBuffers (Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels)
{
    //
    // Allocate memory for samples in all pixel buffers according to the data in sampleCount buffer.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;
        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                if (count)
                    channel[y][x]  = new T[count];
                else
                    channel[y][x]  = nullptr;
            }
        }
    }
}